

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall
wallet::SQLiteBatch::WriteKey(SQLiteBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  void *__stat_loc;
  string *in_R9;
  pointer pbVar5;
  sqlite3_stmt *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    if ((this->m_insert_stmt == (sqlite3_stmt *)0x0) ||
       (this->m_overwrite_stmt == (sqlite3_stmt *)0x0)) {
      __assert_fail("m_insert_stmt && m_overwrite_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1e6,
                    "virtual bool wallet::SQLiteBatch::WriteKey(DataStream &&, DataStream &&, bool)"
                   );
    }
    this_00 = this->m_insert_stmt;
    if (overwrite) {
      this_00 = this->m_overwrite_stmt;
    }
    pbVar5 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    sVar2 = key->m_read_pos;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"key","");
    pbVar5 = pbVar5 + sVar2;
    blob.m_size = (size_t)local_58;
    blob.m_data = pbVar1 + -(long)pbVar5;
    bVar3 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)0x1,(int)pbVar5,blob,in_R9);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (bVar3) {
      pbVar5 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      sVar2 = value->m_read_pos;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"value","");
      pbVar5 = pbVar5 + sVar2;
      __stat_loc = (void *)0x2;
      blob_00.m_size = (size_t)local_58;
      blob_00.m_data = pbVar1 + -(long)pbVar5;
      bVar3 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)0x2,(int)pbVar5,blob_00,in_R9);
      if (local_58[0] != local_48) {
        __stat_loc = (void *)(local_48[0] + 1);
        operator_delete(local_58[0],(ulong)__stat_loc);
      }
      if (bVar3) {
        if (this->m_txn == false) {
          CSemaphore::wait(&this->m_database->m_write_semaphore,__stat_loc);
        }
        iVar4 = sqlite3_step(this_00);
        sqlite3_clear_bindings(this_00);
        sqlite3_reset(this_00);
        bVar3 = iVar4 == 0x65;
        if (!bVar3) {
          local_58[0] = (long *)sqlite3_errstr(iVar4);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file._M_len = 0x61;
          logging_function._M_str = "WriteKey";
          logging_function._M_len = 8;
          LogPrintFormatInternal<char[9],char_const*>
                    (logging_function,source_file,0x1fc,ALL,Info,
                     (ConstevalFormatString<2U>)0x110e89f,(char (*) [9])"WriteKey",(char **)local_58
                    );
        }
        if (this->m_txn == false) {
          CSemaphore::post(&this->m_database->m_write_semaphore);
        }
        goto LAB_00c6a31c;
      }
    }
  }
  bVar3 = false;
LAB_00c6a31c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_database.m_db) return false;
    assert(m_insert_stmt && m_overwrite_stmt);

    sqlite3_stmt* stmt;
    if (overwrite) {
        stmt = m_overwrite_stmt;
    } else {
        stmt = m_insert_stmt;
    }

    // Bind: leftmost parameter in statement is index 1
    // Insert index 1 is key, 2 is value
    if (!BindBlobToStatement(stmt, 1, key, "key")) return false;
    if (!BindBlobToStatement(stmt, 2, value, "value")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}